

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::visitStructNew(Struct2Local *this,StructNew *curr)

{
  Index IVar1;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_00;
  bool bVar2;
  reference pFVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  Expression **ppEVar7;
  const_reference pvVar8;
  Expression *value_00;
  Block *expression;
  optional<wasm::Type> type;
  undefined1 local_118 [12];
  uintptr_t local_108;
  value_type local_100;
  uintptr_t local_f8;
  Literal local_f0;
  LocalSet *local_d8;
  uint local_cc;
  LocalSet *pLStack_c8;
  Index i_2;
  uintptr_t local_c0;
  LocalGet *local_b8;
  LocalGet *value;
  LocalSet *pLStack_a8;
  Index i_1;
  uint local_9c;
  Type TStack_98;
  Index i;
  Index local_8c;
  uintptr_t uStack_88;
  Field field;
  __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
  local_70;
  const_iterator __end3;
  const_iterator __begin3;
  FieldList *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tempIndexes;
  undefined1 local_30 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> contents;
  StructNew *curr_local;
  Struct2Local *this_local;
  
  if (curr == this->allocation) {
    contents.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_30);
    bVar2 = StructNew::isWithDefault(this->allocation);
    if (bVar2) {
      for (local_cc = 0; uVar4 = (ulong)local_cc,
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&this->localIndexes), uVar4 < sVar5; local_cc = local_cc + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->localIndexes,(ulong)local_cc);
        IVar1 = *pvVar6;
        pvVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           (this->fields,(ulong)local_cc);
        local_f8 = (pvVar8->type).id;
        wasm::Literal::makeZero(&local_f0,(Type)local_f8);
        value_00 = Builder::makeConstantExpression(&this->builder,&local_f0);
        local_d8 = Builder::makeLocalSet(&this->builder,IVar1,value_00);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_30,
                   (value_type *)&local_d8);
        wasm::Literal::~Literal(&local_f0);
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      this_00 = this->fields;
      __end3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(this_00);
      local_70._M_current =
           (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&local_70), bVar2) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                 ::operator*(&__end3);
        TStack_98.id = (pFVar3->type).id;
        field.type.id._0_4_ = pFVar3->packedType;
        field.type.id._4_4_ = pFVar3->mutable_;
        uStack_88 = TStack_98.id;
        local_8c = Builder::addVar(this->func,TStack_98);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,&local_8c);
        __gnu_cxx::
        __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
        ::operator++(&__end3);
      }
      for (local_9c = 0; uVar4 = (ulong)local_9c,
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3),
          uVar4 < sVar5; local_9c = local_9c + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,
                            (ulong)local_9c);
        IVar1 = *pvVar6;
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(this->allocation->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)local_9c);
        pLStack_a8 = Builder::makeLocalSet(&this->builder,IVar1,*ppEVar7);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_30,
                   (value_type *)&stack0xffffffffffffff58);
      }
      for (value._4_4_ = 0; uVar4 = (ulong)value._4_4_,
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3),
          uVar4 < sVar5; value._4_4_ = value._4_4_ + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,
                            (ulong)value._4_4_);
        IVar1 = *pvVar6;
        pvVar8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           (this->fields,(ulong)value._4_4_);
        local_c0 = (pvVar8->type).id;
        local_b8 = Builder::makeLocalGet(&this->builder,IVar1,(Type)local_c0);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->localIndexes,(ulong)value._4_4_);
        pLStack_c8 = Builder::makeLocalSet(&this->builder,*pvVar6,(Expression *)local_b8);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_30,
                   (value_type *)&stack0xffffffffffffff38);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    }
    local_108 = (uintptr_t)
                wasm::Type::getHeapType
                          (&(this->allocation->super_SpecificExpression<(wasm::Expression::Id)65>).
                            super_Expression.type);
    local_100 = (value_type)Builder::makeRefNull(&this->builder,(HeapType)local_108);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_30,
               &local_100);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_118);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_118._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_118[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_118._9_3_;
    expression = Builder::
                 makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                           (&this->builder,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            local_30,type);
    replaceCurrent(this,(Expression *)expression);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_30);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (curr != allocation) {
      return;
    }

    // First, assign the initial values to the new locals.
    std::vector<Expression*> contents;

    if (!allocation->isWithDefault()) {
      // We must assign the initial values to temp indexes, then copy them
      // over all at once. If instead we did set them as we go, then we might
      // hit a problem like this:
      //
      //  (local.set X (new_X))
      //  (local.set Y (block (result ..)
      //                 (.. (local.get X) ..) ;; returns new_X, wrongly
      //                 (new_Y)
      //               )
      //
      // Note how we assign to the local X and use it during the assignment to
      // the local Y - but we should still see the old value of X, not new_X.
      // Temp locals X', Y' can ensure that:
      //
      //  (local.set X' (new_X))
      //  (local.set Y' (block (result ..)
      //                  (.. (local.get X) ..) ;; returns the proper, old X
      //                  (new_Y)
      //                )
      //  ..
      //  (local.set X (local.get X'))
      //  (local.set Y (local.get Y'))
      std::vector<Index> tempIndexes;

      for (auto field : fields) {
        tempIndexes.push_back(builder.addVar(func, field.type));
      }

      // Store the initial values into the temp locals.
      for (Index i = 0; i < tempIndexes.size(); i++) {
        contents.push_back(
          builder.makeLocalSet(tempIndexes[i], allocation->operands[i]));
      }

      // Copy them to the normal ones.
      for (Index i = 0; i < tempIndexes.size(); i++) {
        auto* value = builder.makeLocalGet(tempIndexes[i], fields[i].type);
        contents.push_back(builder.makeLocalSet(localIndexes[i], value));
      }

      // TODO Check if the nondefault case does not increase code size in some
      //      cases. A heap allocation that implicitly sets the default values
      //      is smaller than multiple explicit settings of locals to
      //      defaults.
    } else {
      // Set the default values.
      //
      // Note that we must assign the defaults because we might be in a loop,
      // that is, there might be a previous value.
      for (Index i = 0; i < localIndexes.size(); i++) {
        contents.push_back(builder.makeLocalSet(
          localIndexes[i],
          builder.makeConstantExpression(Literal::makeZero(fields[i].type))));
      }
    }

    // Replace the allocation with a null reference. This changes the type
    // from non-nullable to nullable, but as we optimize away the code that
    // the allocation reaches, we will handle that.
    contents.push_back(builder.makeRefNull(allocation->type.getHeapType()));
    replaceCurrent(builder.makeBlock(contents));
  }